

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> * __thiscall
kratos::GeneratorGraph::get_sorted_nodes
          (vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *__return_storage_ptr__
          ,GeneratorGraph *this)

{
  undefined1 local_68 [8];
  queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
  queue;
  
  topological_sort((queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                    *)local_68,this);
  (__return_storage_ptr__->
  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::reserve
            (__return_storage_ptr__,
             ((long)((long)queue.c.
                           super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_first -
                    queue.c.
                    super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                    ._M_impl.super__Deque_impl_data._M_map_size) >> 3) +
             ((long)queue.c.
                    super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node -
              (long)queue.c.
                    super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 3) +
             ((((ulong)((long)queue.c.
                              super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_last -
                       (long)queue.c.
                             super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
             (ulong)(queue.c.
                     super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x40
            );
  while (queue.c.
         super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
         _M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         queue.c.
         super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
         _M_impl.super__Deque_impl_data._M_map_size) {
    std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
    emplace_back<kratos::Generator*&>
              ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)
               __return_storage_ptr__,
               (Generator **)
               (*(long *)queue.c.
                         super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                         ._M_impl.super__Deque_impl_data._M_map_size + 8));
    if ((_Elt_pointer)
        queue.c.super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
        ._M_impl.super__Deque_impl_data._M_map_size ==
        queue.c.super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first + -1) {
      operator_delete(queue.c.
                      super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur,0x200);
      queue.c.super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
      _M_impl.super__Deque_impl_data._M_map_size =
           (size_t)queue.c.
                   super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last[1];
      queue.c.super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first =
           (_Elt_pointer)
           (queue.c.
            super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
            _M_impl.super__Deque_impl_data._M_map_size + 0x200);
      queue.c.super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)
           queue.c.
           super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
           _M_impl.super__Deque_impl_data._M_map_size;
      queue.c.super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_last =
           queue.c.
           super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last + 1;
    }
    else {
      queue.c.super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
      _M_impl.super__Deque_impl_data._M_map_size =
           queue.c.
           super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
           _M_impl.super__Deque_impl_data._M_map_size + 8;
    }
  }
  std::_Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>::~_Deque_base
            ((_Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_> *)
             local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Generator *> GeneratorGraph::get_sorted_nodes() {
    auto queue = topological_sort();
    std::vector<Generator *> result;
    result.reserve(queue.size());
    while (!queue.empty()) {
        result.emplace_back(queue.front()->generator);
        queue.pop();
    }
    return result;
}